

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualFloatArray
               (UNITY_FLOAT *expected,UNITY_FLOAT *actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  int iVar1;
  UNITY_FLOAT *local_48;
  UNITY_FLOAT *ptr_actual;
  UNITY_FLOAT *ptr_expected;
  UNITY_UINT32 elements;
  UNITY_FLAGS_T flags_local;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_UINT32 num_elements_local;
  UNITY_FLOAT *actual_local;
  UNITY_FLOAT *expected_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (expected != actual) {
      iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      local_48 = actual;
      ptr_actual = expected;
      ptr_expected._0_4_ = num_elements;
      if (iVar1 != 0) {
        Unity.CurrentTestFailed = 1;
        longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
      }
      while ((UNITY_UINT32)ptr_expected != 0) {
        iVar1 = UnityFloatsWithin(*ptr_actual * 1e-05,*ptr_actual,*local_48);
        if (iVar1 == 0) {
          UnityTestResultsFailBegin(lineNumber);
          UnityPrint(" Element ");
          UnityPrintNumberUnsigned((ulong)((num_elements - ((UNITY_UINT32)ptr_expected - 1)) - 1));
          UnityPrint(" Expected ");
          UnityPrintFloat(*ptr_actual);
          UnityPrint(" Was ");
          UnityPrintFloat(*local_48);
          UnityAddMsgIfSpecified(msg);
          Unity.CurrentTestFailed = 1;
          longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
        }
        if (flags == UNITY_ARRAY_TO_ARRAY) {
          ptr_actual = ptr_actual + 1;
        }
        local_48 = local_48 + 1;
        ptr_expected._0_4_ = (UNITY_UINT32)ptr_expected - 1;
      }
    }
    return;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualFloatArray(UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* expected,
                                UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* actual,
                                const UNITY_UINT32 num_elements,
                                const char* msg,
                                const UNITY_LINE_TYPE lineNumber,
                                const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 elements = num_elements;
    UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* ptr_expected = expected;
    UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* ptr_actual = actual;

    RETURN_IF_FAIL_OR_IGNORE;

    if (elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    while (elements--)
    {
        if (!UnityFloatsWithin(*ptr_expected * UNITY_FLOAT_PRECISION, *ptr_expected, *ptr_actual))
        {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(UnityStrElement);
            UnityPrintNumberUnsigned(num_elements - elements - 1);
            UNITY_PRINT_EXPECTED_AND_ACTUAL_FLOAT((UNITY_DOUBLE)*ptr_expected, (UNITY_DOUBLE)*ptr_actual);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            ptr_expected++;
        }
        ptr_actual++;
    }
}